

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferViewAccessTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_1::BufferViewTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferViewTestInstance *this)

{
  RefData<vk::Handle<(vk::HandleType)8>_> data;
  RefData<vk::Handle<(vk::HandleType)7>_> data_00;
  RefData<vk::Handle<(vk::HandleType)12>_> data_01;
  RefData<vk::Handle<(vk::HandleType)12>_> data_02;
  DeviceInterface *pDVar1;
  DeviceInterface *pDVar2;
  int iVar3;
  InstanceInterface *pIVar4;
  VkPhysicalDevice pVVar5;
  NotSupportedError *this_00;
  Handle<(vk::HandleType)8> *pHVar6;
  ostream *poVar7;
  Handle<(vk::HandleType)7> *pHVar8;
  allocator<char> local_679;
  string local_678 [4];
  Error *error_3;
  RefData<vk::Handle<(vk::HandleType)12>_> local_5c8;
  undefined1 local_5a8 [8];
  VkBufferViewCreateInfo completeBufferViewCreateInfo;
  Move<vk::Handle<(vk::HandleType)12>_> completeBufferView;
  Error *error_2;
  RefData<vk::Handle<(vk::HandleType)12>_> local_4c0;
  allocator<char> local_499;
  string local_498;
  deUint64 local_478;
  deUint64 local_470;
  Error *error_1;
  RefData<vk::Handle<(vk::HandleType)7>_> local_3d8;
  undefined1 local_3b8 [8];
  VkBufferViewCreateInfo bufferViewCreateInfo;
  Move<vk::Handle<(vk::HandleType)12>_> bufferView;
  VkMemoryAllocateInfo memAlloc;
  Move<vk::Handle<(vk::HandleType)7>_> memory;
  ostringstream local_300 [8];
  ostringstream errorMsg;
  Error *error;
  RefData<vk::Handle<(vk::HandleType)8>_> local_e8;
  undefined1 local_b8 [8];
  VkBufferCreateInfo bufferParams;
  VkFormatProperties properties;
  VkMemoryRequirements memReqs;
  Move<vk::Handle<(vk::HandleType)8>_> testBuffer;
  VkDeviceSize size;
  DeviceInterface *pDStack_28;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice vkDevice;
  BufferViewTestInstance *this_local;
  
  vkDevice = (VkDevice)this;
  this_local = (BufferViewTestInstance *)__return_storage_ptr__;
  vk = (DeviceInterface *)Context::getDevice((this->super_TestInstance).m_context);
  pDStack_28 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  size._4_4_ = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&memReqs.memoryTypeBits);
  local_b8._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferParams._4_4_ = 0;
  bufferParams.pNext._0_4_ = 0;
  bufferParams.flags = 0x1a40;
  bufferParams._20_4_ = 0;
  bufferParams.size._0_4_ = (this->m_testCase).usage;
  bufferParams.size._4_4_ = 0;
  bufferParams.usage = 1;
  bufferParams._40_8_ = (long)&size + 4;
  pIVar4 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar5 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  (*pIVar4->_vptr_InstanceInterface[3])
            (pIVar4,pVVar5,(ulong)(this->m_testCase).format,
             (undefined1 *)((long)&bufferParams.pQueueFamilyIndices + 4));
  if ((properties.linearTilingFeatures & (this->m_testCase).features) != 0) {
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&error,pDStack_28,(VkDevice)vk,
                       (VkBufferCreateInfo *)local_b8,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_e8,(Move *)&error);
    data.deleter.m_deviceIface = local_e8.deleter.m_deviceIface;
    data.object.m_internal = local_e8.object.m_internal;
    data.deleter.m_device = local_e8.deleter.m_device;
    data.deleter.m_allocator = local_e8.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
              ((Move<vk::Handle<(vk::HandleType)8>_> *)&memReqs.memoryTypeBits,data);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)&error);
    pDVar2 = vk;
    pDVar1 = pDStack_28;
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&memReqs.memoryTypeBits);
    (*pDVar1->_vptr_DeviceInterface[0xe])
              (pDVar1,pDVar2,pHVar6->m_internal,&properties.optimalTilingFeatures);
    if ((ulong)properties._4_8_ < 0x1a40) {
      std::__cxx11::ostringstream::ostringstream(local_300);
      poVar7 = std::operator<<((ostream *)local_300,"Requied memory size (");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,properties._4_8_);
      poVar7 = std::operator<<(poVar7," bytes) smaller than the buffer\'s size (");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1a40);
      std::operator<<(poVar7," bytes)!");
      std::__cxx11::ostringstream::str();
      tcu::TestStatus::fail
                (__return_storage_ptr__,
                 (string *)
                 &memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator);
      std::__cxx11::string::~string
                ((string *)
                 &memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator);
      std::__cxx11::ostringstream::~ostringstream(local_300);
    }
    else {
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::Move
                ((Move<vk::Handle<(vk::HandleType)7>_> *)&memAlloc.memoryTypeIndex);
      bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator._0_4_ = 5
      ;
      memAlloc.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      memAlloc._4_4_ = 0;
      memAlloc.pNext = (void *)properties._4_8_;
      memAlloc.allocationSize._0_4_ = deCtz32((deUint32)memReqs.alignment);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::Move
                ((Move<vk::Handle<(vk::HandleType)12>_> *)&bufferViewCreateInfo.range);
      local_3b8._0_4_ = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
      bufferViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      bufferViewCreateInfo._4_4_ = 0;
      bufferViewCreateInfo.pNext._0_4_ = 0;
      pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&memReqs.memoryTypeBits);
      bufferViewCreateInfo._16_8_ = pHVar6->m_internal;
      bufferViewCreateInfo.buffer.m_internal._0_4_ = (this->m_testCase).format;
      bufferViewCreateInfo._32_8_ = (this->m_testCase).offset;
      bufferViewCreateInfo.offset = (this->m_testCase).range;
      ::vk::allocateMemory
                ((Move<vk::Handle<(vk::HandleType)7>_> *)&error_1,pDStack_28,(VkDevice)vk,
                 (VkMemoryAllocateInfo *)
                 &bufferView.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.
                  m_allocator,(VkAllocationCallbacks *)0x0);
      ::vk::refdetails::Move::operator_cast_to_RefData(&local_3d8,(Move *)&error_1);
      data_00.deleter.m_deviceIface = local_3d8.deleter.m_deviceIface;
      data_00.object.m_internal = local_3d8.object.m_internal;
      data_00.deleter.m_device = local_3d8.deleter.m_device;
      data_00.deleter.m_allocator = local_3d8.deleter.m_allocator;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::operator=
                ((Move<vk::Handle<(vk::HandleType)7>_> *)&memAlloc.memoryTypeIndex,data_00);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move
                ((Move<vk::Handle<(vk::HandleType)7>_> *)&error_1);
      pDVar2 = vk;
      pDVar1 = pDStack_28;
      pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&memReqs.memoryTypeBits);
      local_470 = pHVar6->m_internal;
      pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)7>_> *)&memAlloc.memoryTypeIndex);
      local_478 = pHVar8->m_internal;
      iVar3 = (*pDVar1->_vptr_DeviceInterface[0xc])(pDVar1,pDVar2,local_470,local_478,0);
      if (iVar3 == 0) {
        ::vk::createBufferView
                  ((Move<vk::Handle<(vk::HandleType)12>_> *)&error_2,pDStack_28,(VkDevice)vk,
                   (VkBufferViewCreateInfo *)local_3b8,(VkAllocationCallbacks *)0x0);
        ::vk::refdetails::Move::operator_cast_to_RefData(&local_4c0,(Move *)&error_2);
        data_01.deleter.m_deviceIface = local_4c0.deleter.m_deviceIface;
        data_01.object.m_internal = local_4c0.object.m_internal;
        data_01.deleter.m_device = local_4c0.deleter.m_device;
        data_01.deleter.m_allocator = local_4c0.deleter.m_allocator;
        ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::operator=
                  ((Move<vk::Handle<(vk::HandleType)12>_> *)&bufferViewCreateInfo.range,data_01);
        ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::~Move
                  ((Move<vk::Handle<(vk::HandleType)12>_> *)&error_2);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_498,"Bind buffer memory failed!",&local_499);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_498);
        std::__cxx11::string::~string((string *)&local_498);
        std::allocator<char>::~allocator(&local_499);
      }
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::~Move
                ((Move<vk::Handle<(vk::HandleType)12>_> *)&bufferViewCreateInfo.range);
      if (iVar3 == 0) {
        ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::Move
                  ((Move<vk::Handle<(vk::HandleType)12>_> *)&completeBufferViewCreateInfo.range);
        local_5a8._0_4_ = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
        completeBufferViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        completeBufferViewCreateInfo._4_4_ = 0;
        completeBufferViewCreateInfo.pNext._0_4_ = 0;
        pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                           ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&memReqs.memoryTypeBits);
        completeBufferViewCreateInfo._16_8_ = pHVar6->m_internal;
        completeBufferViewCreateInfo.buffer.m_internal._0_4_ = (this->m_testCase).format;
        completeBufferViewCreateInfo._32_8_ = (this->m_testCase).offset;
        completeBufferViewCreateInfo.offset = 0x1a40;
        ::vk::createBufferView
                  ((Move<vk::Handle<(vk::HandleType)12>_> *)&error_3,pDStack_28,(VkDevice)vk,
                   (VkBufferViewCreateInfo *)local_5a8,(VkAllocationCallbacks *)0x0);
        ::vk::refdetails::Move::operator_cast_to_RefData(&local_5c8,(Move *)&error_3);
        data_02.deleter.m_deviceIface = local_5c8.deleter.m_deviceIface;
        data_02.object.m_internal = local_5c8.object.m_internal;
        data_02.deleter.m_device = local_5c8.deleter.m_device;
        data_02.deleter.m_allocator = local_5c8.deleter.m_allocator;
        ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::operator=
                  ((Move<vk::Handle<(vk::HandleType)12>_> *)&completeBufferViewCreateInfo.range,
                   data_02);
        ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::~Move
                  ((Move<vk::Handle<(vk::HandleType)12>_> *)&error_3);
        ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::~Move
                  ((Move<vk::Handle<(vk::HandleType)12>_> *)&completeBufferViewCreateInfo.range);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_678,"BufferView test",&local_679);
        tcu::TestStatus::pass(__return_storage_ptr__,local_678);
        std::__cxx11::string::~string((string *)local_678);
        std::allocator<char>::~allocator(&local_679);
      }
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move
                ((Move<vk::Handle<(vk::HandleType)7>_> *)&memAlloc.memoryTypeIndex);
    }
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)&memReqs.memoryTypeBits);
    return __return_storage_ptr__;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Format not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferViewCreateTests.cpp"
             ,0x75);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestStatus BufferViewTestInstance::iterate (void)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();
	const VkSubmitInfo			submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,
		0u,
		(const VkSemaphore*)DE_NULL,
		(const VkPipelineStageFlags*)DE_NULL,
		1u,
		&m_cmdBuffer.get(),
		0u,
		(const VkSemaphore*)DE_NULL,
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity */));

	tcu::TestStatus				testStatus	= checkResult();
	if (testStatus.getCode() != QP_TEST_RESULT_PASS)
	{
		return testStatus;
	}

	// Generate and bind another buffer
	std::vector<deUint32>		uniformData;
	const VkDeviceSize			uniformSize = m_testCase.bufferSize * sizeof(deUint32);
	const deInt8				factor		= 2;

	generateBuffer(uniformData, m_testCase.bufferSize, factor);
	deMemcpy(m_uniformBufferAlloc->getHostPtr(), uniformData.data(), (size_t)uniformSize);

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity */));

	return checkResult(factor);
}